

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cgltf.c
# Opt level: O0

void cgltf_free(cgltf_data *data)

{
  ulong local_a0;
  cgltf_size i_12;
  cgltf_size i_11;
  cgltf_size i_10;
  cgltf_size i_9;
  cgltf_size i_8;
  cgltf_size i_7;
  cgltf_size i_6;
  cgltf_size i_5;
  cgltf_size i_4;
  cgltf_size i_3;
  cgltf_size i_2;
  cgltf_size j_1;
  cgltf_size m;
  cgltf_size k_1;
  cgltf_size k;
  cgltf_size j;
  cgltf_size i_1;
  cgltf_size i;
  cgltf_data *data_local;
  
  if (data != (cgltf_data *)0x0) {
    (*data->memory_free)(data->memory_user_data,(data->asset).copyright);
    (*data->memory_free)(data->memory_user_data,(data->asset).generator);
    (*data->memory_free)(data->memory_user_data,(data->asset).version);
    (*data->memory_free)(data->memory_user_data,(data->asset).min_version);
    (*data->memory_free)(data->memory_user_data,data->accessors);
    (*data->memory_free)(data->memory_user_data,data->buffer_views);
    for (i_1 = 0; i_1 < data->buffers_count; i_1 = i_1 + 1) {
      if (data->buffers[i_1].data != data->bin) {
        (*data->memory_free)(data->memory_user_data,data->buffers[i_1].data);
      }
      (*data->memory_free)(data->memory_user_data,data->buffers[i_1].uri);
    }
    (*data->memory_free)(data->memory_user_data,data->buffers);
    for (j = 0; j < data->meshes_count; j = j + 1) {
      (*data->memory_free)(data->memory_user_data,data->meshes[j].name);
      for (k = 0; k < data->meshes[j].primitives_count; k = k + 1) {
        for (k_1 = 0; k_1 < data->meshes[j].primitives[k].attributes_count; k_1 = k_1 + 1) {
          (*data->memory_free)
                    (data->memory_user_data,data->meshes[j].primitives[k].attributes[k_1].name);
        }
        (*data->memory_free)(data->memory_user_data,data->meshes[j].primitives[k].attributes);
        for (m = 0; m < data->meshes[j].primitives[k].targets_count; m = m + 1) {
          for (j_1 = 0; j_1 < data->meshes[j].primitives[k].targets[m].attributes_count;
              j_1 = j_1 + 1) {
            (*data->memory_free)
                      (data->memory_user_data,
                       data->meshes[j].primitives[k].targets[m].attributes[j_1].name);
          }
          (*data->memory_free)
                    (data->memory_user_data,data->meshes[j].primitives[k].targets[m].attributes);
        }
        (*data->memory_free)(data->memory_user_data,data->meshes[j].primitives[k].targets);
      }
      (*data->memory_free)(data->memory_user_data,data->meshes[j].primitives);
      (*data->memory_free)(data->memory_user_data,data->meshes[j].weights);
      for (i_2 = 0; i_2 < data->meshes[j].target_names_count; i_2 = i_2 + 1) {
        (*data->memory_free)(data->memory_user_data,data->meshes[j].target_names[i_2]);
      }
      (*data->memory_free)(data->memory_user_data,data->meshes[j].target_names);
    }
    (*data->memory_free)(data->memory_user_data,data->meshes);
    for (i_3 = 0; i_3 < data->materials_count; i_3 = i_3 + 1) {
      (*data->memory_free)(data->memory_user_data,data->materials[i_3].name);
    }
    (*data->memory_free)(data->memory_user_data,data->materials);
    for (i_4 = 0; i_4 < data->images_count; i_4 = i_4 + 1) {
      (*data->memory_free)(data->memory_user_data,data->images[i_4].name);
      (*data->memory_free)(data->memory_user_data,data->images[i_4].uri);
      (*data->memory_free)(data->memory_user_data,data->images[i_4].mime_type);
    }
    (*data->memory_free)(data->memory_user_data,data->images);
    for (i_5 = 0; i_5 < data->textures_count; i_5 = i_5 + 1) {
      (*data->memory_free)(data->memory_user_data,data->textures[i_5].name);
    }
    (*data->memory_free)(data->memory_user_data,data->textures);
    (*data->memory_free)(data->memory_user_data,data->samplers);
    for (i_6 = 0; i_6 < data->skins_count; i_6 = i_6 + 1) {
      (*data->memory_free)(data->memory_user_data,data->skins[i_6].name);
      (*data->memory_free)(data->memory_user_data,data->skins[i_6].joints);
    }
    (*data->memory_free)(data->memory_user_data,data->skins);
    for (i_7 = 0; i_7 < data->cameras_count; i_7 = i_7 + 1) {
      (*data->memory_free)(data->memory_user_data,data->cameras[i_7].name);
    }
    (*data->memory_free)(data->memory_user_data,data->cameras);
    for (i_8 = 0; i_8 < data->lights_count; i_8 = i_8 + 1) {
      (*data->memory_free)(data->memory_user_data,data->lights[i_8].name);
    }
    (*data->memory_free)(data->memory_user_data,data->lights);
    for (i_9 = 0; i_9 < data->nodes_count; i_9 = i_9 + 1) {
      (*data->memory_free)(data->memory_user_data,data->nodes[i_9].name);
      (*data->memory_free)(data->memory_user_data,data->nodes[i_9].children);
      (*data->memory_free)(data->memory_user_data,data->nodes[i_9].weights);
    }
    (*data->memory_free)(data->memory_user_data,data->nodes);
    for (i_10 = 0; i_10 < data->scenes_count; i_10 = i_10 + 1) {
      (*data->memory_free)(data->memory_user_data,data->scenes[i_10].name);
      (*data->memory_free)(data->memory_user_data,data->scenes[i_10].nodes);
    }
    (*data->memory_free)(data->memory_user_data,data->scenes);
    for (i_11 = 0; i_11 < data->animations_count; i_11 = i_11 + 1) {
      (*data->memory_free)(data->memory_user_data,data->animations[i_11].name);
      (*data->memory_free)(data->memory_user_data,data->animations[i_11].samplers);
      (*data->memory_free)(data->memory_user_data,data->animations[i_11].channels);
    }
    (*data->memory_free)(data->memory_user_data,data->animations);
    for (i_12 = 0; i_12 < data->extensions_used_count; i_12 = i_12 + 1) {
      (*data->memory_free)(data->memory_user_data,data->extensions_used[i_12]);
    }
    (*data->memory_free)(data->memory_user_data,data->extensions_used);
    for (local_a0 = 0; local_a0 < data->extensions_required_count; local_a0 = local_a0 + 1) {
      (*data->memory_free)(data->memory_user_data,data->extensions_required[local_a0]);
    }
    (*data->memory_free)(data->memory_user_data,data->extensions_required);
    (*data->memory_free)(data->memory_user_data,data->file_data);
    (*data->memory_free)(data->memory_user_data,data);
  }
  return;
}

Assistant:

void cgltf_free(cgltf_data* data)
{
    if (!data)
    {
        return;
    }

    data->memory_free(data->memory_user_data, data->asset.copyright);
    data->memory_free(data->memory_user_data, data->asset.generator);
    data->memory_free(data->memory_user_data, data->asset.version);
    data->memory_free(data->memory_user_data, data->asset.min_version);

    data->memory_free(data->memory_user_data, data->accessors);
    data->memory_free(data->memory_user_data, data->buffer_views);

    for (cgltf_size i = 0; i < data->buffers_count; ++i)
    {
        if (data->buffers[i].data != data->bin)
        {
            data->memory_free(data->memory_user_data, data->buffers[i].data);
        }

        data->memory_free(data->memory_user_data, data->buffers[i].uri);
    }

    data->memory_free(data->memory_user_data, data->buffers);

    for (cgltf_size i = 0; i < data->meshes_count; ++i)
    {
        data->memory_free(data->memory_user_data, data->meshes[i].name);

        for (cgltf_size j = 0; j < data->meshes[i].primitives_count; ++j)
        {
            for (cgltf_size k = 0; k < data->meshes[i].primitives[j].attributes_count; ++k)
            {
                data->memory_free(data->memory_user_data, data->meshes[i].primitives[j].attributes[k].name);
            }

            data->memory_free(data->memory_user_data, data->meshes[i].primitives[j].attributes);

            for (cgltf_size k = 0; k < data->meshes[i].primitives[j].targets_count; ++k)
            {
                for (cgltf_size m = 0; m < data->meshes[i].primitives[j].targets[k].attributes_count; ++m)
                {
                    data->memory_free(data->memory_user_data, data->meshes[i].primitives[j].targets[k].attributes[m].name);
                }

                data->memory_free(data->memory_user_data, data->meshes[i].primitives[j].targets[k].attributes);
            }

            data->memory_free(data->memory_user_data, data->meshes[i].primitives[j].targets);
        }

        data->memory_free(data->memory_user_data, data->meshes[i].primitives);
        data->memory_free(data->memory_user_data, data->meshes[i].weights);

        for (cgltf_size j = 0; j < data->meshes[i].target_names_count; ++j)
        {
            data->memory_free(data->memory_user_data, data->meshes[i].target_names[j]);
        }

        data->memory_free(data->memory_user_data, data->meshes[i].target_names);
    }

    data->memory_free(data->memory_user_data, data->meshes);

    for (cgltf_size i = 0; i < data->materials_count; ++i)
    {
        data->memory_free(data->memory_user_data, data->materials[i].name);
    }

    data->memory_free(data->memory_user_data, data->materials);

    for (cgltf_size i = 0; i < data->images_count; ++i)
    {
        data->memory_free(data->memory_user_data, data->images[i].name);
        data->memory_free(data->memory_user_data, data->images[i].uri);
        data->memory_free(data->memory_user_data, data->images[i].mime_type);
    }

    data->memory_free(data->memory_user_data, data->images);

    for (cgltf_size i = 0; i < data->textures_count; ++i)
    {
        data->memory_free(data->memory_user_data, data->textures[i].name);
    }

    data->memory_free(data->memory_user_data, data->textures);

    data->memory_free(data->memory_user_data, data->samplers);

    for (cgltf_size i = 0; i < data->skins_count; ++i)
    {
        data->memory_free(data->memory_user_data, data->skins[i].name);
        data->memory_free(data->memory_user_data, data->skins[i].joints);
    }

    data->memory_free(data->memory_user_data, data->skins);

    for (cgltf_size i = 0; i < data->cameras_count; ++i)
    {
        data->memory_free(data->memory_user_data, data->cameras[i].name);
    }

    data->memory_free(data->memory_user_data, data->cameras);

    for (cgltf_size i = 0; i < data->lights_count; ++i)
    {
        data->memory_free(data->memory_user_data, data->lights[i].name);
    }

    data->memory_free(data->memory_user_data, data->lights);

    for (cgltf_size i = 0; i < data->nodes_count; ++i)
    {
        data->memory_free(data->memory_user_data, data->nodes[i].name);
        data->memory_free(data->memory_user_data, data->nodes[i].children);
        data->memory_free(data->memory_user_data, data->nodes[i].weights);
    }

    data->memory_free(data->memory_user_data, data->nodes);

    for (cgltf_size i = 0; i < data->scenes_count; ++i)
    {
        data->memory_free(data->memory_user_data, data->scenes[i].name);
        data->memory_free(data->memory_user_data, data->scenes[i].nodes);
    }

    data->memory_free(data->memory_user_data, data->scenes);

    for (cgltf_size i = 0; i < data->animations_count; ++i)
    {
        data->memory_free(data->memory_user_data, data->animations[i].name);
        data->memory_free(data->memory_user_data, data->animations[i].samplers);
        data->memory_free(data->memory_user_data, data->animations[i].channels);
    }

    data->memory_free(data->memory_user_data, data->animations);

    for (cgltf_size i = 0; i < data->extensions_used_count; ++i)
    {
        data->memory_free(data->memory_user_data, data->extensions_used[i]);
    }

    data->memory_free(data->memory_user_data, data->extensions_used);

    for (cgltf_size i = 0; i < data->extensions_required_count; ++i)
    {
        data->memory_free(data->memory_user_data, data->extensions_required[i]);
    }

    data->memory_free(data->memory_user_data, data->extensions_required);

    data->memory_free(data->memory_user_data, data->file_data);

    data->memory_free(data->memory_user_data, data);
}